

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicState2::Run(BasicState2 *this)

{
  GLenum GVar1;
  uint local_20;
  uint local_1c;
  GLuint i;
  GLint p;
  BasicState2 *this_local;
  
  _i = this;
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  local_20 = 0;
  while( true ) {
    if (0xf < local_20) {
      glu::CallLogWrapper::glVertexBindingDivisor
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,2);
      glu::CallLogWrapper::glGetIntegeri_v
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x82d6,1,(GLint *)&local_1c);
      if (local_1c == 2) {
        this_local = (BasicState2 *)0x0;
      }
      else {
        anon_unknown_0::Output
                  ("GL_VERTEX_ATTRIB_ARRAY_DIVISOR(1) is %d should be 2.\n",(ulong)local_1c);
        this_local = (BasicState2 *)&DAT_ffffffffffffffff;
      }
      return (long)this_local;
    }
    glu::CallLogWrapper::glGetIntegeri_v
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x82d6,local_20,(GLint *)&local_1c);
    GVar1 = glu::CallLogWrapper::glGetError
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar1 != 0) break;
    if (local_1c != 0) {
      anon_unknown_0::Output
                ("GL_VERTEX_BINDING_DIVISOR(%u) is %d should be 0.\n",(ulong)local_20,
                 (ulong)local_1c);
      return (long)&DAT_ffffffffffffffff;
    }
    local_20 = local_20 + 1;
  }
  anon_unknown_0::Output
            ("glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, ...) command generates error.\n");
  return (long)&DAT_ffffffffffffffff;
}

Assistant:

virtual long Run()
	{
		GLint p;
		glBindVertexArray(m_vao);
		for (GLuint i = 0; i < 16; ++i)
		{
			glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, i, &p);
			if (glGetError() != GL_NO_ERROR)
			{
				Output("glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, ...) command generates error.\n");
				return ERROR;
			}
			if (p != 0)
			{
				Output("GL_VERTEX_BINDING_DIVISOR(%u) is %d should be 0.\n", i, p);
				return ERROR;
			}
		}
		glVertexBindingDivisor(1, 2);
		glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, 1, &p);
		if (p != 2)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_DIVISOR(1) is %d should be 2.\n", p);
			return ERROR;
		}
		return NO_ERROR;
	}